

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * cuddAddMonadicApplyRecur(DdManager *dd,DD_MAOP op,DdNode *f)

{
  DdHalfWord index_00;
  DdNode *f_00;
  DdManager *T_00;
  DdManager *E_00;
  DdManager *local_60;
  uint index;
  DdNode *E;
  DdNode *T;
  DdNode *fe;
  DdNode *ft;
  DdNode *res;
  DdNode *f_local;
  DD_MAOP op_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)(*op)(dd,f);
  if ((dd_local == (DdManager *)0x0) &&
     (dd_local = (DdManager *)cuddCacheLookup1(dd,op,f), dd_local == (DdManager *)0x0)) {
    index_00 = f->index;
    f_00 = (f->type).kids.E;
    T_00 = (DdManager *)cuddAddMonadicApplyRecur(dd,op,(f->type).kids.T);
    if (T_00 == (DdManager *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
      E_00 = (DdManager *)cuddAddMonadicApplyRecur(dd,op,f_00);
      if (E_00 == (DdManager *)0x0) {
        Cudd_RecursiveDeref(dd,(DdNode *)T_00);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
        local_60 = T_00;
        if (T_00 != E_00) {
          local_60 = (DdManager *)cuddUniqueInter(dd,index_00,(DdNode *)T_00,(DdNode *)E_00);
        }
        if (local_60 == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T_00);
          Cudd_RecursiveDeref(dd,(DdNode *)E_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert1(dd,op,f,&local_60->sentinel);
          dd_local = local_60;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddMonadicApplyRecur(
  DdManager * dd,
  DD_MAOP op,
  DdNode * f)
{
    DdNode *res, *ft, *fe, *T, *E;
    unsigned int index;

    /* Check terminal cases. */
    statLine(dd);
    res = (*op)(dd,f);
    if (res != NULL) return(res);

    /* Check cache. */
    res = cuddCacheLookup1(dd,op,f);
    if (res != NULL) return(res);

    /* Recursive step. */
    index = f->index;
    ft = cuddT(f);
    fe = cuddE(f);

    T = cuddAddMonadicApplyRecur(dd,op,ft);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddMonadicApplyRecur(dd,op,fe);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,(int)index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,op,f,res);

    return(res);

}